

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall wasm::Printer::run(Printer *this,Module *module)

{
  undefined1 local_1a8 [8];
  PrintSExpression print;
  
  PrintSExpression::PrintSExpression((PrintSExpression *)local_1a8,this->o);
  print.lastPrintedLocation.super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
  _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload._M_value.
  symbolNameIndex.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_engaged =
       (((this->super_Pass).runner)->options).debugInfo;
  PrintSExpression::visitModule((PrintSExpression *)local_1a8,module);
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&print.typePrinter.fallback.nameCache._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&print.typePrinter.fallback.arrayCount);
  std::
  _Hashtable<wasm::Signature,_std::pair<const_wasm::Signature,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::Signature,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Signature>,_std::hash<wasm::Signature>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Signature,_std::pair<const_wasm::Signature,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::Signature,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Signature>,_std::hash<wasm::Signature>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&print.heapTypes.
                    super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  if (print._144_8_ != 0) {
    operator_delete((void *)print._144_8_,
                    (long)print.heapTypes.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_finish - print._144_8_);
  }
  if (print.moduleStackIR.super__Optional_base<wasm::ModuleStackIR,_false,_false>._M_payload.
      super__Optional_payload<wasm::ModuleStackIR,_true,_false,_false>.
      super__Optional_payload_base<wasm::ModuleStackIR>._M_payload.field2[0x30] == '\x01') {
    print.moduleStackIR.super__Optional_base<wasm::ModuleStackIR,_false,_false>._M_payload.
    super__Optional_payload<wasm::ModuleStackIR,_true,_false,_false>.
    super__Optional_payload_base<wasm::ModuleStackIR>._M_payload.field2[0x30] = 0;
    std::
    _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>_>_>_>
                 *)&print.moduleStackIR);
  }
  return;
}

Assistant:

void run(Module* module) override {
    PrintSExpression print(o);
    print.setDebugInfo(getPassOptions().debugInfo);
    print.visitModule(module);
  }